

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

OwnPromiseNode kj::_::neverDone(void)

{
  int iVar1;
  PromiseNode *in_RDI;
  
  if (neverDone()::NODE == '\0') {
    iVar1 = __cxa_guard_acquire(&neverDone()::NODE);
    if (iVar1 != 0) {
      __cxa_atexit(AsyncObject::~AsyncObject,&neverDone::NODE,&__dso_handle);
      __cxa_guard_release(&neverDone()::NODE);
    }
  }
  (in_RDI->super_PromiseArenaMember)._vptr_PromiseArenaMember = (_func_int **)&neverDone::NODE;
  return (OwnPromiseNode)in_RDI;
}

Assistant:

OwnPromiseNode neverDone() {
  class NeverDonePromiseNode final: public _::PromiseNode {
  public:
    void destroy() override {}

    void onReady(_::Event* event) noexcept override {
      // ignore
    }
    void get(_::ExceptionOrValue& output) noexcept override {
      KJ_FAIL_REQUIRE("Not ready.");
    }
    void tracePromise(_::TraceBuilder& builder, bool stopAtNextEvent) override {
      builder.add(_::getMethodStartAddress(kj::NEVER_DONE, &_::NeverDone::wait));
    }
  };

  static NeverDonePromiseNode NODE;
  return OwnPromiseNode(&NODE);
}